

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_array_init(BigArray *array,void *buf,char *dtype,int ndim,size_t *dims,ptrdiff_t *strides)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ptrdiff_t *ppVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = 0;
  memset(array,0,0x220);
  _dtype_normalize(array->dtype,dtype);
  array->data = buf;
  array->ndim = ndim;
  memset(array->dims,0,0x200);
  array->size = 1;
  uVar3 = 0;
  if (0 < ndim) {
    uVar3 = (ulong)(uint)ndim;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    sVar1 = dims[uVar5];
    array->dims[uVar5] = sVar1;
    array->size = sVar1 * array->size;
  }
  if (strides == (ptrdiff_t *)0x0) {
    iVar2 = big_file_dtype_itemsize(dtype);
    array->strides[(int)(ndim - 1U)] = (long)iVar2;
    ppVar4 = array->strides + (ndim - 1U);
    for (uVar6 = ndim - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      array->strides[uVar6] = ppVar4[-0x20] * *ppVar4;
      ppVar4 = ppVar4 + -1;
    }
  }
  else {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      array->strides[uVar5] = strides[uVar5];
    }
  }
  return 0;
}

Assistant:

int
big_array_init(BigArray * array, void * buf, const char * dtype, int ndim, const size_t dims[], const ptrdiff_t strides[])
{

    memset(array, 0, sizeof(array[0]));

    _dtype_normalize(array->dtype, dtype);
    array->data = buf;
    array->ndim = ndim;
    int i;
    memset(array->dims, 0, sizeof(ptrdiff_t) * 32);
    memset(array->strides, 0, sizeof(ptrdiff_t) * 32);
    array->size = 1;
    for(i = 0; i < ndim; i ++) {
        array->dims[i] = dims[i];
        array->size *= dims[i];
    }
    if(strides != NULL) {
        for(i = 0; i < ndim; i ++) {
            array->strides[i] = strides[i];
        }
    } else {
        array->strides[ndim - 1] = big_file_dtype_itemsize(dtype);
        for(i = ndim - 2; i >= 0; i --) {
            array->strides[i] = array->strides[i + 1] * array->dims[i + 1];
        }
    }
    return 0;
}